

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

DenseMapPair<DBKeyID,_llbuild::core::KeyID> * __thiscall
llvm::
DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::InsertIntoBucketImpl<DBKeyID>
          (DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
           *this,DBKeyID *Key,DBKeyID *Lookup,DenseMapPair<DBKeyID,_llbuild::core::KeyID> *TheBucket
          )

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  DBKeyID *LHS;
  DBKeyID local_38;
  DBKeyID EmptyKey;
  uint NumBuckets;
  uint NewNumEntries;
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *TheBucket_local;
  DBKeyID *Lookup_local;
  DBKeyID *Key_local;
  DenseMapBase<llvm::DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>,_DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  *this_local;
  
  _NumBuckets = TheBucket;
  TheBucket_local = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)Lookup;
  Lookup_local = Key;
  Key_local = (DBKeyID *)this;
  DebugEpochBase::incrementEpoch((DebugEpochBase *)this);
  uVar3 = getNumEntries(this);
  EmptyKey.value._4_4_ = uVar3 + 1;
  uVar3 = getNumBuckets(this);
  iVar1 = EmptyKey.value._4_4_;
  EmptyKey.value._0_4_ = uVar3;
  if ((uint)(EmptyKey.value._4_4_ << 2) < uVar3 * 3) {
    uVar4 = getNumTombstones(this);
    if (uVar3 - (iVar1 + uVar4) <= (uint)EmptyKey.value >> 3) {
      grow(this,(uint)EmptyKey.value);
      LookupBucketFor<DBKeyID>
                (this,(DBKeyID *)TheBucket_local,
                 (DenseMapPair<DBKeyID,_llbuild::core::KeyID> **)&NumBuckets);
    }
  }
  else {
    grow(this,uVar3 << 1);
    LookupBucketFor<DBKeyID>
              (this,(DBKeyID *)TheBucket_local,
               (DenseMapPair<DBKeyID,_llbuild::core::KeyID> **)&NumBuckets);
    EmptyKey.value._0_4_ = getNumBuckets(this);
  }
  if (_NumBuckets == (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0) {
    __assert_fail("TheBucket",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                  ,0x22a,
                  "BucketT *llvm::DenseMapBase<llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, DBKeyID, llbuild::core::KeyID, llvm::DenseMapInfo<DBKeyID>, llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>>::InsertIntoBucketImpl(const KeyT &, const LookupKeyT &, BucketT *) [DerivedT = llvm::DenseMap<DBKeyID, llbuild::core::KeyID>, KeyT = DBKeyID, ValueT = llbuild::core::KeyID, KeyInfoT = llvm::DenseMapInfo<DBKeyID>, BucketT = llvm::detail::DenseMapPair<DBKeyID, llbuild::core::KeyID>, LookupKeyT = DBKeyID]"
                 );
  }
  incrementNumEntries(this);
  local_38 = getEmptyKey();
  LHS = detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>::getFirst(_NumBuckets);
  bVar2 = DenseMapInfo<DBKeyID>::isEqual(LHS,&local_38);
  if (!bVar2) {
    decrementNumTombstones(this);
  }
  return _NumBuckets;
}

Assistant:

BucketT *InsertIntoBucketImpl(const KeyT &Key, const LookupKeyT &Lookup,
                                BucketT *TheBucket) {
    incrementEpoch();

    // If the load of the hash table is more than 3/4, or if fewer than 1/8 of
    // the buckets are empty (meaning that many are filled with tombstones),
    // grow the table.
    //
    // The later case is tricky.  For example, if we had one empty bucket with
    // tons of tombstones, failing lookups (e.g. for insertion) would have to
    // probe almost the entire table until it found the empty bucket.  If the
    // table completely filled with tombstones, no lookup would ever succeed,
    // causing infinite loops in lookup.
    unsigned NewNumEntries = getNumEntries() + 1;
    unsigned NumBuckets = getNumBuckets();
    if (LLVM_UNLIKELY(NewNumEntries * 4 >= NumBuckets * 3)) {
      this->grow(NumBuckets * 2);
      LookupBucketFor(Lookup, TheBucket);
      NumBuckets = getNumBuckets();
    } else if (LLVM_UNLIKELY(NumBuckets-(NewNumEntries+getNumTombstones()) <=
                             NumBuckets/8)) {
      this->grow(NumBuckets);
      LookupBucketFor(Lookup, TheBucket);
    }
    assert(TheBucket);

    // Only update the state after we've grown our bucket space appropriately
    // so that when growing buckets we have self-consistent entry count.
    incrementNumEntries();

    // If we are writing over a tombstone, remember this.
    const KeyT EmptyKey = getEmptyKey();
    if (!KeyInfoT::isEqual(TheBucket->getFirst(), EmptyKey))
      decrementNumTombstones();

    return TheBucket;
  }